

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
TimedMutexTest_TryLockUntilTimeout_Test<yamc::checked::recursive_timed_mutex>::
~TimedMutexTest_TryLockUntilTimeout_Test
          (TimedMutexTest_TryLockUntilTimeout_Test<yamc::checked::recursive_timed_mutex> *this)

{
  TimedMutexTest_TryLockUntilTimeout_Test<yamc::checked::recursive_timed_mutex> *this_local;
  
  ~TimedMutexTest_TryLockUntilTimeout_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockUntilTimeout)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    yamc::test::stopwatch<> sw;
    EXPECT_FALSE(mtx.try_lock_until(std::chrono::system_clock::now() + TEST_EXPECT_TIMEOUT));
    EXPECT_LE(TEST_EXPECT_TIMEOUT, sw.elapsed());
    step.await();  // b2
  }
}